

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O2

char * xmemmem(char *hay,size_t hz_,char *ndl,size_t nz)

{
  int iVar1;
  byte *pbVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte bVar6;
  byte bVar7;
  
  pbVar2 = (byte *)memchr(hay,(int)*ndl,hz_);
  if (pbVar2 != (byte *)0x0) {
    bVar6 = *pbVar2;
    bVar3 = true;
    pbVar5 = pbVar2;
    bVar7 = bVar6;
    for (pbVar4 = (byte *)(ndl + 1);
        (pbVar5 = pbVar5 + 1, pbVar5 < hay + hz_ && (pbVar4 < ndl + nz)); pbVar4 = pbVar4 + 1) {
      bVar6 = bVar6 ^ *pbVar5;
      bVar7 = bVar7 ^ *pbVar4;
      if (*pbVar5 != *pbVar4) {
        bVar3 = false;
      }
    }
    if (ndl + nz <= pbVar4) {
      if (bVar3) {
        return (char *)pbVar2;
      }
      pbVar4 = pbVar2;
      while( true ) {
        pbVar2 = pbVar2 + 1;
        if (hay + hz_ <= pbVar5) break;
        bVar6 = *pbVar5 ^ bVar6 ^ *pbVar4;
        if ((bVar6 == bVar7) && (iVar1 = bcmp(pbVar4 + 1,ndl,nz - 1), iVar1 == 0)) {
          return (char *)pbVar2;
        }
        pbVar5 = pbVar5 + 1;
        pbVar4 = pbVar4 + 1;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

static char*
xmemmem(const char *hay, const size_t hz_, const char *ndl, const size_t nz)
{
	const char *const eoh = hay + hz_;
	const char *const eon = ndl + nz;
	const char *hp;
	const char *np;
	const char *cand;
	unsigned int hsum;
	unsigned int nsum;
	unsigned int eqp;

	/* trivial checks first
         * a 0-sized needle is defined to be found anywhere in haystack
         * then run strchr() to find a candidate in HAYSTACK (i.e. a portion
         * that happens to begin with *NEEDLE) */
	if (nz == 0UL) {
		return deconst(hay);
	} else if ((hay = memchr(hay, *ndl, hz_)) == NULL) {
		/* trivial */
		return NULL;
	}

	/* First characters of haystack and needle are the same now. Both are
	 * guaranteed to be at least one character long.  Now computes the sum
	 * of characters values of needle together with the sum of the first
	 * needle_len characters of haystack. */
	for (hp = hay + 1U, np = ndl + 1U, hsum = *hay, nsum = *hay, eqp = 1U;
	     hp < eoh && np < eon;
	     hsum ^= *hp, nsum ^= *np, eqp &= *hp == *np, hp++, np++);

	/* HP now references the (NZ + 1)-th character. */
	if (np < eon) {
		/* haystack is smaller than needle, :O */
		return NULL;
	} else if (eqp) {
		/* found a match */
		return deconst(hay);
	}

	/* now loop through the rest of haystack,
	 * updating the sum iteratively */
	for (cand = hay; hp < eoh; hp++) {
		hsum ^= *cand++;
		hsum ^= *hp;

		/* Since the sum of the characters is already known to be
		 * equal at that point, it is enough to check just NZ - 1
		 * characters for equality,
		 * also CAND is by design < HP, so no need for range checks */
		if (hsum == nsum && memcmp(cand, ndl, nz - 1U) == 0) {
			return deconst(cand);
		}
	}
	return NULL;
}